

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

char * __thiscall
tetgenio::readnumberline(tetgenio *this,char *string,FILE *infile,char *infilename)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  
  pbVar2 = (byte *)fgets(string,0x800,(FILE *)infile);
  do {
    if (pbVar2 == (byte *)0x0) {
      return (char *)0x0;
    }
    while( true ) {
      bVar1 = *pbVar2;
      uVar3 = (ulong)bVar1;
      if (uVar3 < 0x2f) {
        if ((0x800000001U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_0010df57;
        if ((0x680000000000U >> (uVar3 & 0x3f) & 1) != 0) {
          return (char *)pbVar2;
        }
      }
      if (0xf5 < (byte)(bVar1 - 0x3a)) break;
      pbVar2 = pbVar2 + 1;
    }
    if ((bVar1 != 0x23) && (bVar1 != 0)) {
      return (char *)pbVar2;
    }
LAB_0010df57:
    pbVar2 = (byte *)fgets(string,0x800,(FILE *)infile);
  } while( true );
}

Assistant:

char* tetgenio::readnumberline(char *string, FILE *infile, char *infilename)
{
  char *result;

  // Search for something that looks like a number.
  do {
    result = fgets(string, INPUTLINESIZE, infile);
    if (result == (char *) NULL) {
      return result;
    }
    // Skip anything that doesn't look like a number, a comment, 
    //   or the end of a line. 
    while ((*result != '\0') && (*result != '#')
           && (*result != '.') && (*result != '+') && (*result != '-')
           && ((*result < '0') || (*result > '9'))) {
      result++;
    }
    // If it's a comment or end of line, read another line and try again.
  } while ((*result == '#') || (*result == '\0'));
  return result;
}